

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O0

PHashSHA2_256 * pp_crypto_hash_sha2_256_new_internal(pboolean is224)

{
  PHashSHA2_256 *ret;
  PHashSHA2_256 *pPStack_10;
  pboolean is224_local;
  
  pPStack_10 = (PHashSHA2_256 *)p_malloc0(0x6c);
  if (pPStack_10 == (PHashSHA2_256 *)0x0) {
    pPStack_10 = (PHashSHA2_256 *)0x0;
  }
  else {
    pPStack_10->is224 = is224;
    p_crypto_hash_sha2_256_reset(pPStack_10);
  }
  return pPStack_10;
}

Assistant:

static PHashSHA2_256 *
pp_crypto_hash_sha2_256_new_internal (pboolean is224)
{
	PHashSHA2_256 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_256))) == NULL))
		return NULL;

	ret->is224 = is224;

	p_crypto_hash_sha2_256_reset (ret);

	return ret;
}